

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

void icu_63::initializeSystemDefaultCentury(void)

{
  UBool UVar1;
  UDate UVar2;
  int32_t newYear;
  UDate newStart;
  Locale local_380;
  undefined1 local_2a0 [8];
  BuddhistCalendar calendar;
  UErrorCode status;
  
  calendar.super_GregorianCalendar._652_4_ = 0;
  Locale::Locale(&local_380,"@calendar=buddhist",(char *)0x0,(char *)0x0,(char *)0x0);
  BuddhistCalendar::BuddhistCalendar
            ((BuddhistCalendar *)local_2a0,&local_380,
             (UErrorCode *)&calendar.super_GregorianCalendar.field_0x28c);
  Locale::~Locale(&local_380);
  UVar1 = ::U_SUCCESS(calendar.super_GregorianCalendar._652_4_);
  if (UVar1 != '\0') {
    UVar2 = Calendar::getNow();
    Calendar::setTime((Calendar *)local_2a0,UVar2,
                      (UErrorCode *)&calendar.super_GregorianCalendar.field_0x28c);
    Calendar::add((Calendar *)local_2a0,UCAL_YEAR,-0x50,
                  (UErrorCode *)&calendar.super_GregorianCalendar.field_0x28c);
    UVar2 = Calendar::getTime((Calendar *)local_2a0,
                              (UErrorCode *)&calendar.super_GregorianCalendar.field_0x28c);
    gSystemDefaultCenturyStartYear =
         Calendar::get((Calendar *)local_2a0,UCAL_YEAR,
                       (UErrorCode *)&calendar.super_GregorianCalendar.field_0x28c);
    gSystemDefaultCenturyStart = UVar2;
  }
  BuddhistCalendar::~BuddhistCalendar((BuddhistCalendar *)local_2a0);
  return;
}

Assistant:

static void U_CALLCONV initializeSystemDefaultCentury()
{
    // initialize systemDefaultCentury and systemDefaultCenturyYear based
    // on the current time.  They'll be set to 80 years before
    // the current time.
    UErrorCode status = U_ZERO_ERROR;
    HebrewCalendar calendar(Locale("@calendar=hebrew"),status);
    if (U_SUCCESS(status)) {
        calendar.setTime(Calendar::getNow(), status);
        calendar.add(UCAL_YEAR, -80, status);

        gSystemDefaultCenturyStart = calendar.getTime(status);
        gSystemDefaultCenturyStartYear = calendar.get(UCAL_YEAR, status);
    }
    // We have no recourse upon failure unless we want to propagate the failure
    // out.
}